

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpression.cpp
# Opt level: O0

void __thiscall hdc::LiteralExpression::LiteralExpression(LiteralExpression *this,Token *token)

{
  Token *token_local;
  LiteralExpression *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression).super_Statement.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00220cc8;
  Token::Token(&this->token);
  Token::operator=(&this->token,token);
  return;
}

Assistant:

LiteralExpression::LiteralExpression(Token token) {
    this->token = token;
}